

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_first_byte,bool want_earliest_match,
          bool run_forward)

{
  byte bVar1;
  bool bVar2;
  const_pointer pcVar3;
  size_type sVar4;
  void *pvVar5;
  uint8_t *puVar6;
  size_type sVar7;
  const_iterator pcVar8;
  const_iterator pcVar9;
  DFA *pDVar10;
  ostream *poVar11;
  byte in_CL;
  byte in_DL;
  StringPiece *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  int id_2;
  int i_2;
  StateSaver save_s_1;
  State *ns;
  int lastbyte;
  int id_1;
  int i_1;
  StateSaver save_s;
  StateSaver save_start;
  State *ns_1;
  int c;
  int id;
  int i;
  State *s;
  bool matched;
  uint8_t *lastmatch;
  uint8_t *bytemap;
  uint8_t *resetp;
  uint8_t *ep;
  uint8_t *p;
  uint8_t *bp;
  State *start;
  int in_stack_fffffffffffffb7c;
  StateSaver *in_stack_fffffffffffffb80;
  DFA *in_stack_fffffffffffffb88;
  LogMessage *in_stack_fffffffffffffb90;
  LogMessage *this_00;
  DFA *in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  int c_00;
  DFA *in_stack_fffffffffffffba8;
  DFA *in_stack_fffffffffffffbb0;
  DFA *in_stack_fffffffffffffbb8;
  LogMessage *in_stack_fffffffffffffbc0;
  int local_424;
  StateSaver *in_stack_fffffffffffffd28;
  StateSaver *local_278;
  MatchKind local_264;
  LogMessage local_260;
  int local_e0;
  DFA *local_80;
  uint local_74;
  int local_70;
  MatchKind local_6c;
  DFA *local_68;
  byte local_59;
  byte *local_58;
  uint8_t *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  byte *local_30;
  DFA *local_28;
  byte local_1b;
  byte local_1a;
  byte local_19;
  StringPiece *local_18;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_1b = in_R8B & 1;
  local_28 = (DFA *)in_RSI[2].size_;
  local_18 = in_RSI;
  pcVar3 = StringPiece::data(in_RSI);
  local_38 = BytePtr(pcVar3);
  local_30 = local_38;
  pcVar3 = StringPiece::data(local_18);
  sVar4 = StringPiece::size(local_18);
  local_40 = BytePtr(pcVar3 + sVar4);
  local_48 = (byte *)0x0;
  if ((local_1b & 1) == 0) {
    std::swap<unsigned_char_const*>(&local_38,&local_40);
  }
  local_50 = Prog::bytemap((Prog *)*in_RDI);
  local_58 = (byte *)0x0;
  local_59 = 0;
  local_68 = local_28;
  bVar2 = State::IsMatch((State *)local_28);
  if (bVar2) {
    local_59 = 1;
    local_58 = local_38;
    if ((local_18[5].data_ != (const_pointer)0x0) && (*(int *)(in_RDI + 1) == 3)) {
      local_6c = local_68->kind_;
      while ((local_6c = local_6c - kLongestMatch, -1 < (int)local_6c &&
             (local_70 = local_68->prog_->inst_count_[(long)(int)local_6c + -9], local_70 != -2))) {
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
      }
    }
    if ((local_1a & 1) != 0) {
      local_18[4].size_ = (size_type)local_58;
      local_1 = 1;
      goto LAB_0022acf0;
    }
  }
  do {
    do {
      c_00 = (int)((ulong)in_stack_fffffffffffffba0 >> 0x20);
      if (local_38 == local_40) goto LAB_0022a8df;
      if (((local_19 & 1) != 0) && (local_68 == local_28)) {
        if ((local_1b & 1) == 0) {
          pvVar5 = memrchr(local_40,*(int *)&local_18[3].data_,(long)local_38 - (long)local_40);
          puVar6 = BytePtr(pvVar5);
          c_00 = (int)((ulong)in_stack_fffffffffffffba0 >> 0x20);
          if (puVar6 != (uint8_t *)0x0) {
            local_38 = puVar6 + 1;
            goto LAB_0022a3f5;
          }
          local_38 = local_40;
        }
        else {
          pvVar5 = memchr(local_38,*(int *)&local_18[3].data_,(long)local_40 - (long)local_38);
          local_38 = BytePtr(pvVar5);
          c_00 = (int)((ulong)in_stack_fffffffffffffba0 >> 0x20);
          if (local_38 != (byte *)0x0) goto LAB_0022a3f5;
          local_38 = local_40;
        }
LAB_0022a8df:
        if ((local_1b & 1) == 0) {
          in_stack_fffffffffffffb98 = (DFA *)StringPiece::begin(local_18);
          pDVar10 = (DFA *)StringPiece::begin(local_18 + 1);
          if (in_stack_fffffffffffffb98 != pDVar10) {
            StringPiece::begin(local_18);
          }
        }
        else {
          pcVar8 = StringPiece::end(local_18);
          pcVar9 = StringPiece::end(local_18 + 1);
          if (pcVar8 != pcVar9) {
            StringPiece::end(local_18);
          }
          c_00 = (int)((ulong)pcVar8 >> 0x20);
        }
        this_00 = (LogMessage *)&local_68->mutex_;
        ByteMap(in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        local_278 = (StateSaver *)
                    std::atomic<re2::DFA::State_*>::load
                              ((atomic<re2::DFA::State_*> *)in_stack_fffffffffffffb88,
                               (memory_order)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        if ((local_278 == (StateSaver *)0x0) &&
           (local_278 = (StateSaver *)
                        RunStateOnByteUnlocked
                                  (in_stack_fffffffffffffbb0,(State *)in_stack_fffffffffffffba8,c_00
                                  ), local_278 == (StateSaver *)0x0)) {
          StateSaver::StateSaver
                    ((StateSaver *)this_00,in_stack_fffffffffffffb88,
                     (State *)in_stack_fffffffffffffb80);
          ResetCache(in_stack_fffffffffffffb98,(RWLocker *)this_00);
          local_68 = (DFA *)StateSaver::Restore(in_stack_fffffffffffffd28);
          if (local_68 == (DFA *)0x0) {
            *(undefined1 *)&local_18[4].data_ = 1;
            local_1 = 0;
            local_e0 = 1;
          }
          else {
            local_278 = (StateSaver *)
                        RunStateOnByteUnlocked
                                  (in_stack_fffffffffffffbb0,(State *)in_stack_fffffffffffffba8,c_00
                                  );
            in_stack_fffffffffffffb80 = local_278;
            if (local_278 == (StateSaver *)0x0) {
              LogMessage::LogMessage
                        (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
                         (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
              poVar11 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffbe0);
              std::operator<<(poVar11,"RunStateOnByteUnlocked failed after Reset");
              LogMessage::~LogMessage(this_00);
              *(undefined1 *)&local_18[4].data_ = 1;
              local_1 = 0;
              local_e0 = 1;
            }
            else {
              local_e0 = 0;
            }
          }
          StateSaver::~StateSaver(in_stack_fffffffffffffb80);
          if (local_e0 != 0) goto LAB_0022acf0;
        }
        if (local_278 < (StateSaver *)0x3) {
          if (local_278 == (StateSaver *)0x1) {
            local_18[4].size_ = (size_type)local_58;
            local_1 = local_59 & 1;
          }
          else {
            local_18[4].size_ = (size_type)local_40;
            local_1 = 1;
          }
        }
        else {
          local_68 = (DFA *)local_278;
          bVar2 = State::IsMatch((State *)local_278);
          if (bVar2) {
            local_59 = 1;
            local_58 = local_38;
            if ((local_18[5].data_ != (const_pointer)0x0) && (*(int *)(in_RDI + 1) == 3)) {
              local_424 = local_68->kind_;
              while ((local_424 = local_424 + -1, -1 < local_424 &&
                     (*(int *)((long)&((DFA *)local_68->prog_)->prog_ + (long)local_424 * 4) != -2))
                    ) {
                SparseSetT<void>::insert
                          ((SparseSetT<void> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
              }
            }
          }
          local_18[4].size_ = (size_type)local_58;
          local_1 = local_59 & 1;
        }
        goto LAB_0022acf0;
      }
LAB_0022a3f5:
      if ((local_1b & 1) == 0) {
        bVar1 = local_38[-1];
        local_38 = local_38 + -1;
      }
      else {
        bVar1 = *local_38;
        local_38 = local_38 + 1;
      }
      local_74 = (uint)bVar1;
      local_80 = (DFA *)std::atomic<re2::DFA::State_*>::load
                                  ((atomic<re2::DFA::State_*> *)in_stack_fffffffffffffb88,
                                   (memory_order)((ulong)in_stack_fffffffffffffb80 >> 0x20));
      if ((local_80 == (DFA *)0x0) &&
         (local_80 = (DFA *)RunStateOnByteUnlocked
                                      (in_stack_fffffffffffffbb0,(State *)in_stack_fffffffffffffba8,
                                       (int)((ulong)in_stack_fffffffffffffba0 >> 0x20)),
         local_80 == (DFA *)0x0)) {
        if (((dfa_should_bail_when_slow & 1) != 0) && (local_48 != (byte *)0x0)) {
          in_stack_fffffffffffffbc0 = (LogMessage *)(local_38 + -(long)local_48);
          sVar7 = std::
                  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                  ::size((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                          *)0x22a4f9);
          if ((in_stack_fffffffffffffbc0 < (LogMessage *)(sVar7 * 10)) &&
             (*(int *)(in_RDI + 1) != 3)) {
            *(undefined1 *)&local_18[4].data_ = 1;
            local_1 = 0;
            goto LAB_0022acf0;
          }
        }
        local_48 = local_38;
        StateSaver::StateSaver
                  ((StateSaver *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                   (State *)in_stack_fffffffffffffb80);
        StateSaver::StateSaver
                  ((StateSaver *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                   (State *)in_stack_fffffffffffffb80);
        ResetCache(in_stack_fffffffffffffb98,(RWLocker *)in_stack_fffffffffffffb90);
        in_stack_fffffffffffffbb8 = (DFA *)StateSaver::Restore(in_stack_fffffffffffffd28);
        local_28 = in_stack_fffffffffffffbb8;
        if ((in_stack_fffffffffffffbb8 == (DFA *)0x0) ||
           (in_stack_fffffffffffffbb0 = (DFA *)StateSaver::Restore(in_stack_fffffffffffffd28),
           local_68 = in_stack_fffffffffffffbb0, in_stack_fffffffffffffbb0 == (DFA *)0x0)) {
          *(undefined1 *)&local_18[4].data_ = 1;
          local_1 = 0;
          local_e0 = 1;
        }
        else {
          in_stack_fffffffffffffba8 =
               (DFA *)RunStateOnByteUnlocked
                                (in_stack_fffffffffffffbb0,(State *)in_stack_fffffffffffffba8,
                                 (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
          local_80 = in_stack_fffffffffffffba8;
          if (in_stack_fffffffffffffba8 == (DFA *)0x0) {
            LogMessage::LogMessage
                      (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
                       (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
            poVar11 = LogMessage::stream(&local_260);
            std::operator<<(poVar11,"RunStateOnByteUnlocked failed after ResetCache");
            LogMessage::~LogMessage(in_stack_fffffffffffffb90);
            *(undefined1 *)&local_18[4].data_ = 1;
            local_1 = 0;
            local_e0 = 1;
          }
          else {
            local_e0 = 0;
          }
        }
        StateSaver::~StateSaver(in_stack_fffffffffffffb80);
        StateSaver::~StateSaver(in_stack_fffffffffffffb80);
        if (local_e0 != 0) goto LAB_0022acf0;
      }
      if (local_80 < (DFA *)0x3) {
        if (local_80 == (DFA *)0x1) {
          local_18[4].size_ = (size_type)local_58;
          local_1 = local_59 & 1;
        }
        else {
          local_18[4].size_ = (size_type)local_40;
          local_1 = 1;
        }
        goto LAB_0022acf0;
      }
      local_68 = local_80;
      bVar2 = State::IsMatch((State *)local_80);
    } while (!bVar2);
    local_59 = 1;
    if ((local_1b & 1) == 0) {
      local_58 = local_38 + 1;
    }
    else {
      local_58 = local_38 + -1;
    }
    if ((local_18[5].data_ != (const_pointer)0x0) && (*(int *)(in_RDI + 1) == 3)) {
      local_264 = local_68->kind_;
      while ((local_264 = local_264 - kLongestMatch, -1 < (int)local_264 &&
             (local_68->prog_->inst_count_[(long)(int)local_264 + -9] != -2))) {
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c);
      }
    }
  } while ((local_1a & 1) == 0);
  local_18[4].size_ = (size_type)local_58;
  local_1 = 1;
LAB_0022acf0:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_first_byte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;
  if (ExtraDebug)
    fprintf(stderr, "@stx: %s\n", DumpState(s).c_str());

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @stx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (ExtraDebug)
      fprintf(stderr, "@%td: %s\n",
              p - bp, DumpState(s).c_str());

    if (have_first_byte && s == start) {
      // In start state, only way out is to find first_byte,
      // so use optimized assembly in memchr to skip ahead.
      // If first_byte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->first_byte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->first_byte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (ExtraDebug)
        fprintf(stderr, "match @%td! [%s]\n",
                lastmatch - bp, DumpState(s).c_str());
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  if (ExtraDebug)
    fprintf(stderr, "@etx: %s\n", DumpState(s).c_str());

  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (ExtraDebug)
      fprintf(stderr, "match @etx! [%s]\n", DumpState(s).c_str());
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}